

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dothrow.c
# Opt level: O0

int multishot_max(monst *mtmp,obj *otmp)

{
  char cVar1;
  short sVar2;
  short sVar3;
  xchar xVar4;
  int skill_00;
  bool bVar5;
  int local_50;
  obj *local_48;
  int iStack_34;
  xchar sklev;
  short lotyp;
  short otyp;
  int multishot;
  obj *wwep;
  schar skill;
  boolean you_shot;
  obj *otmp_local;
  monst *mtmp_local;
  
  iStack_34 = 1;
  if (mtmp == (monst *)0x0) {
    return 1;
  }
  bVar5 = mtmp != &youmonst;
  cVar1 = objects[otmp->otyp].oc_subtyp;
  if (bVar5) {
    local_48 = mtmp->mw;
  }
  else {
    local_48 = uwep;
  }
  if (((((otmp->oclass != '\x02') && (otmp->oclass != '\r')) ||
       (objects[otmp->otyp].oc_subtyp < -0x18)) ||
      (((-0x16 < objects[otmp->otyp].oc_subtyp || (local_48 == (obj *)0x0)) ||
       ((int)objects[otmp->otyp].oc_subtyp != -(int)objects[local_48->otyp].oc_subtyp)))) &&
     ((((otmp->oclass != '\x02' ||
        (((otmp->oclass == '\x02' || (otmp->oclass == '\r')) &&
         (((-0x19 < objects[otmp->otyp].oc_subtyp && (objects[otmp->otyp].oc_subtyp < -0x15)) &&
          (((((otmp->oclass != '\x02' && (otmp->oclass != '\r')) ||
             (objects[otmp->otyp].oc_subtyp < -0x18)) ||
            ((-0x16 < objects[otmp->otyp].oc_subtyp || (local_48 == (obj *)0x0)))) ||
           ((int)objects[otmp->otyp].oc_subtyp != -(int)objects[local_48->otyp].oc_subtyp)))))))) ||
       ((((otmp->oclass != '\x02' || (objects[otmp->otyp].oc_subtyp < '\x12')) ||
         ('\x13' < objects[otmp->otyp].oc_subtyp)) &&
        (((objects[otmp->otyp].oc_subtyp != -0x18 && (objects[otmp->otyp].oc_subtyp != -0x1a)) &&
         (objects[otmp->otyp].oc_subtyp != -0x1b)))))) &&
      (((cVar1 != '\x01' && (cVar1 != -0x19)) && (cVar1 != -0x1a)))))) {
    return 1;
  }
  if (bVar5) {
    if ((*(uint *)&mtmp->field_0x60 >> 0x15 & 1) != 0) {
      return 1;
    }
    if ((*(uint *)&mtmp->field_0x60 >> 0x14 & 1) != 0) {
      return 1;
    }
  }
  else {
    if (u.uprops[0x1c].intrinsic != 0) {
      return 1;
    }
    if (u.uprops[0x1b].intrinsic != 0) {
      return 1;
    }
    if (u.umonnum == 0x9e) {
      return 1;
    }
    if ((youmonst.data)->mlet == '\x1c') {
      return 1;
    }
  }
  sVar2 = otmp->otyp;
  if (((otmp->oclass == '\x02') || (otmp->oclass == '\r')) &&
     ((-0x19 < objects[otmp->otyp].oc_subtyp &&
      (((objects[otmp->otyp].oc_subtyp < -0x15 && (local_48 != (obj *)0x0)) &&
       ((int)objects[otmp->otyp].oc_subtyp == -(int)objects[local_48->otyp].oc_subtyp)))))) {
    sVar3 = local_48->otyp;
  }
  else {
    sVar3 = 0;
  }
  skill_00 = weapon_type(otmp);
  xVar4 = mon_skill_level(skill_00,mtmp);
  if (xVar4 == '\x04') {
    iStack_34 = 3;
  }
  else if (xVar4 == '\x03') {
    iStack_34 = 2;
  }
  if ((cVar1 == '\x13') && ((bVar5 || ('\x01' < u.weapon_skills[0x13].skill)))) {
    iStack_34 = iStack_34 + 1;
  }
  if (bVar5) {
    local_50 = monsndx(mtmp->data);
  }
  else {
    local_50 = (int)urole.malenum;
  }
  if (local_50 == 0x163) {
    iStack_34 = iStack_34 + 1;
  }
  else if (local_50 == 0x164) {
    if (cVar1 == '\x01') {
      iStack_34 = iStack_34 + 1;
    }
  }
  else if (((local_50 == 0x165) || (local_50 == 0x18e)) && ((sVar2 == 5 && (sVar3 == 0x45)))) {
    iStack_34 = iStack_34 + 1;
  }
  if (bVar5) {
    if ((mtmp->data->mflags2 & 0x10) != 0) goto LAB_001aa4f8;
  }
  else if (urace.malenum == 0x111) {
LAB_001aa4f8:
    if (((sVar2 == 2) && (sVar3 == 0x43)) || (sVar2 == 0xb)) {
      iStack_34 = iStack_34 + 1;
    }
    return iStack_34;
  }
  if (bVar5) {
    if ((mtmp->data->mflags2 & 0x20) == 0) goto LAB_001aa565;
  }
  else if (urace.malenum != 0x2d) {
LAB_001aa565:
    if (bVar5) {
      if ((mtmp->data->mflags2 & 0x80) == 0) {
        return iStack_34;
      }
    }
    else if (urace.malenum != 0x4a) {
      return iStack_34;
    }
    if (((sVar2 != 3) || (sVar3 != 0x44)) && (sVar2 != 0xc)) {
      return iStack_34;
    }
    return iStack_34 + 1;
  }
  if (sVar2 != 0xd) {
    return iStack_34;
  }
  return iStack_34 + 1;
}

Assistant:

int multishot_max(const struct monst *mtmp, const struct obj *otmp)
{
	boolean you_shot;
	schar skill;
	const struct obj *wwep;
	int multishot = 1;

	if (!mtmp)
	    return 1;

	you_shot = (mtmp == &youmonst);

	skill = objects[otmp->otyp].oc_skill;
	wwep = you_shot ? uwep : MON_WEP(mtmp);

	if ((ammo_and_launcher(otmp, wwep) || is_heavyshot(otmp, wwep) ||
	     skill == P_DAGGER || skill == -P_DART || skill == -P_SHURIKEN) &&
	    !(you_shot ? (Confusion || Stunned) :
			 (mtmp->mconf || mtmp->mstun))) {
	    short otyp, lotyp;
	    xchar sklev;
	    otyp = otmp->otyp;
	    lotyp = ammo_and_launcher(otmp, wwep) ? wwep->otyp : 0;
	    sklev = mon_skill_level(weapon_type(otmp), mtmp);

	    /* bonus for skill */
	    if (sklev == P_EXPERT) {
		multishot += 2;
	    } else if (sklev == P_SKILLED) {
		multishot++;
	    }

	    /* bonus for javelins so they're not just inferior spears */
	    if (skill == P_JAVELIN && (!you_shot || P_SKILL(P_JAVELIN) >= P_BASIC))
		multishot++;

	    /* bonus for role */
	    switch (you_shot ? Role_switch :
			       monsndx(mtmp->data)) {
	    case PM_RANGER:
		multishot++;
		break;
	    case PM_ROGUE:
		if (skill == P_DAGGER)
		    multishot++;
		break;
	    case PM_NINJA: /* for monsters */
	    case PM_SAMURAI:
		if (otyp == YA && lotyp == YUMI)
		    multishot++;
		break;
	    default:
		break;	/* No bonus */
	    }

	    /* bonus for race */
	    if (you_shot ? (Race_switch == PM_ELF) :
			   is_elf(mtmp->data)) {
		if ((otyp == ELVEN_ARROW && lotyp == ELVEN_BOW) ||
		    otyp == ELVEN_SPEAR)
		    multishot++;
	    } else if (you_shot ? (Race_switch == PM_DWARF) :
				  is_dwarf(mtmp->data)) {
		if (otyp == DWARVISH_SPEAR)
		    multishot++;
	    } else if (you_shot ? (Race_switch == PM_ORC) :
				  is_orc(mtmp->data)) {
		if ((otyp == ORCISH_ARROW && lotyp == ORCISH_BOW) ||
		    otyp == ORCISH_SPEAR)
		    multishot++;
	    }
	}

	return multishot;
}